

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

GraphId __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::GetId(GraphCycles *this,void *ptr)

{
  bool bVar1;
  uint32_t uVar2;
  Node **ppNVar3;
  Node *pNVar4;
  uint32_t *puVar5;
  uintptr_t uVar6;
  Node *n_1;
  Node *pNStack_30;
  int32_t r;
  Node *n;
  void *pvStack_20;
  int32_t i;
  void *ptr_local;
  GraphCycles *this_local;
  
  pvStack_20 = ptr;
  ptr_local = this;
  uVar2 = anon_unknown_0::PointerMap::Find(&this->rep_->ptrmap_,ptr);
  n._4_4_ = uVar2;
  if (uVar2 == 0xffffffff) {
    bVar1 = anon_unknown_0::Vec<int>::empty(&this->rep_->free_nodes_);
    if (bVar1) {
      pNVar4 = (Node *)base_internal::LowLevelAlloc::AllocWithArena
                                 (0x1d0,synchronization_internal::(anonymous_namespace)::arena);
      anon_unknown_0::Node::Node(pNVar4);
      pNVar4->version = 1;
      pNVar4->visited = false;
      pNStack_30 = pNVar4;
      uVar2 = anon_unknown_0::
              Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::size
                        (&this->rep_->nodes_);
      pNStack_30->rank = uVar2;
      uVar6 = base_internal::HidePtr<void>(pvStack_20);
      pNStack_30->masked_ptr = uVar6;
      pNStack_30->nstack = 0;
      pNStack_30->priority = 0;
      anon_unknown_0::
      Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::push_back
                (&this->rep_->nodes_,&stack0xffffffffffffffd0);
      anon_unknown_0::PointerMap::Add(&this->rep_->ptrmap_,pvStack_20,pNStack_30->rank);
      this_local = (GraphCycles *)anon_unknown_0::MakeId(pNStack_30->rank,pNStack_30->version);
    }
    else {
      puVar5 = (uint32_t *)anon_unknown_0::Vec<int>::back(&this->rep_->free_nodes_);
      uVar2 = *puVar5;
      anon_unknown_0::Vec<int>::pop_back(&this->rep_->free_nodes_);
      ppNVar3 = anon_unknown_0::
                Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
                operator[](&this->rep_->nodes_,uVar2);
      pNVar4 = *ppNVar3;
      uVar6 = base_internal::HidePtr<void>(pvStack_20);
      pNVar4->masked_ptr = uVar6;
      pNVar4->nstack = 0;
      pNVar4->priority = 0;
      anon_unknown_0::PointerMap::Add(&this->rep_->ptrmap_,pvStack_20,uVar2);
      this_local = (GraphCycles *)anon_unknown_0::MakeId(uVar2,pNVar4->version);
    }
  }
  else {
    ppNVar3 = anon_unknown_0::
              Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
              operator[](&this->rep_->nodes_,uVar2);
    this_local = (GraphCycles *)anon_unknown_0::MakeId(uVar2,(*ppNVar3)->version);
  }
  return (GraphId)(uint64_t)this_local;
}

Assistant:

GraphId GraphCycles::GetId(void* ptr) {
  int32_t i = rep_->ptrmap_.Find(ptr);
  if (i != -1) {
    return MakeId(i, rep_->nodes_[static_cast<uint32_t>(i)]->version);
  } else if (rep_->free_nodes_.empty()) {
    Node* n =
        new (base_internal::LowLevelAlloc::AllocWithArena(sizeof(Node), arena))
            Node;
    n->version = 1;  // Avoid 0 since it is used by InvalidGraphId()
    n->visited = false;
    n->rank = static_cast<int32_t>(rep_->nodes_.size());
    n->masked_ptr = base_internal::HidePtr(ptr);
    n->nstack = 0;
    n->priority = 0;
    rep_->nodes_.push_back(n);
    rep_->ptrmap_.Add(ptr, n->rank);
    return MakeId(n->rank, n->version);
  } else {
    // Preserve preceding rank since the set of ranks in use must be
    // a permutation of [0,rep_->nodes_.size()-1].
    int32_t r = rep_->free_nodes_.back();
    rep_->free_nodes_.pop_back();
    Node* n = rep_->nodes_[static_cast<uint32_t>(r)];
    n->masked_ptr = base_internal::HidePtr(ptr);
    n->nstack = 0;
    n->priority = 0;
    rep_->ptrmap_.Add(ptr, r);
    return MakeId(r, n->version);
  }
}